

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_setopt.c
# Opt level: O0

CURLcode tool_setopt_slist(CURL *curl,GlobalConfig *config,char *name,CURLoption tag,
                          curl_slist *list)

{
  uint local_38;
  CURLcode local_34;
  int i;
  CURLcode ret;
  curl_slist *list_local;
  char *pcStack_20;
  CURLoption tag_local;
  char *name_local;
  GlobalConfig *config_local;
  CURL *curl_local;
  
  local_34 = 0;
  _i = list;
  list_local._4_4_ = tag;
  pcStack_20 = name;
  name_local = (char *)config;
  config_local = (GlobalConfig *)curl;
  local_34 = curl_easy_setopt(curl,tag,list);
  if ((((*(long *)(name_local + 0x38) != 0) && (_i != (curl_slist *)0x0)) && (local_34 == CURLE_OK))
     && (local_34 = libcurl_generate_slist(_i,(int *)&local_38), local_34 == CURLE_OK)) {
    local_34 = easysrc_addf(&easysrc_code,"curl_easy_setopt(hnd, %s, slist%d);",pcStack_20,
                            (ulong)local_38);
  }
  return local_34;
}

Assistant:

CURLcode tool_setopt_slist(CURL *curl, struct GlobalConfig *config,
                           const char *name, CURLoption tag,
                           struct curl_slist *list)
{
  CURLcode ret = CURLE_OK;

  ret = curl_easy_setopt(curl, tag, list);

  if(config->libcurl && list && !ret) {
    int i;

    ret = libcurl_generate_slist(list, &i);
    if(!ret)
      CODE2("curl_easy_setopt(hnd, %s, slist%d);", name, i);
  }

 nomem:
  return ret;
}